

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNNNUn.h
# Opt level: O1

void __thiscall NaPNNNUnit::~NaPNNNUnit(NaPNNNUnit *this)

{
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNNNUnit_001780b0;
  (this->deck)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00178180;
  NaDynAr<NaNNUnit>::clean(&this->deck);
  NaPetriCnOutput::~NaPetriCnOutput(&this->y);
  NaPetriCnInput::~NaPetriCnInput(&this->x);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  operator_delete(this,0x148);
  return;
}

Assistant:

class PNNA_API NaPNNNUnit : public NaPetriNode
{
public:

  // Create node for Petri network
  NaPNNNUnit (const char* szNodeName = "nnunit");


  ////////////////
  // Connectors //
  ////////////////

  // Input (mainstream)
  NaPetriCnInput	x;

  // Output (mainstream)
  NaPetriCnOutput	y;


  ///////////////////
  // Node specific //
  ///////////////////

  // Assign new neural net unit
  void		set_nn_unit (NaNNUnit* pNN);

  // Get neural net unit pointer
  NaNNUnit*	get_nn_unit ();

  // For compatibility reason
  void		set_transfer_func (NaNNUnit* pNN);

  // Request state storage
  void		need_nn_deck (bool bDeckRequest, unsigned nSkipFirst = 0);

  // Put actual state of NN to the deck (first-in first-out)
  void		push_nn ();

  // Get the most ancient state of NN from the deck (first-in first-out)
  void		pop_nn (NaNNUnit& nnunit);


  ///////////////////////
  // Phases of network //
  ///////////////////////

  // 1. Open input data and get their dimensions
  virtual void  open_input_data ();

  // 5. Verification to be sure all is OK (true)
  virtual bool	verify ();

  // 6. Initialize node activity and setup starter flag if needed
  virtual void	initialize (bool& starter);

  // 8. True action of the node (if activate returned true)
  virtual void	action ();

protected:/* data */

  // Neural net unit
  NaNNUnit		*nn;

  // 'true' to provide deck and 'false' to decline
  bool			need_deck;

  // number of nn items to skip before starting to store them
  unsigned		skip_deck, skip_rest;

  // First-in first-out structure
  NaDynAr<NaNNUnit>	deck;

}